

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O2

string * absl::flags_internal::AbslUnparseFlag_abi_cxx11_(string_view v)

{
  string *in_RDI;
  allocator<char> local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)in_RDI,&local_18,&local_19);
  return in_RDI;
}

Assistant:

std::string AbslUnparseFlag(absl::string_view v) { return std::string(v); }